

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString VStringFromFormat(char *format,__va_list_tag *args)

{
  int iVar1;
  ulong uVar2;
  SimpleString *other;
  __va_list_tag *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar3;
  char *in_RSI;
  SimpleString *in_RDI;
  SimpleString SVar4;
  char *newBuffer;
  size_t newBufferSize;
  size_t size;
  char defaultBuffer [100];
  va_list argsCopy;
  SimpleString *resultString;
  SimpleString *in_stack_fffffffffffffee8;
  SimpleString *size_00;
  undefined4 in_stack_ffffffffffffff00;
  char local_a8 [112];
  __va_list_tag local_38;
  __va_list_tag *local_18;
  char *local_10;
  
  local_38.reg_save_area = in_RDX->reg_save_area;
  local_38.gp_offset = in_RDX->gp_offset;
  local_38.fp_offset = in_RDX->fp_offset;
  local_38.overflow_arg_area = in_RDX->overflow_arg_area;
  size_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  SimpleString::SimpleString(in_RDI,(char *)in_stack_fffffffffffffee8);
  iVar1 = (*PlatformSpecificVSNprintf)(local_a8,100,local_10,local_18);
  uVar2 = (ulong)iVar1;
  if (uVar2 < 100) {
    SimpleString::SimpleString(in_RDI,(char *)in_stack_fffffffffffffee8);
    SimpleString::operator=(in_RDI,in_stack_fffffffffffffee8);
    SimpleString::~SimpleString((SimpleString *)0x173277);
    sVar3 = extraout_RDX;
  }
  else {
    other = (SimpleString *)
            SimpleString::allocStringBuffer
                      ((size_t)in_RDI,(char *)in_stack_fffffffffffffee8,0x1732cf);
    (*PlatformSpecificVSNprintf)((char *)other,uVar2 + 1,local_10,&local_38);
    SimpleString::SimpleString(in_RDI,(char *)other);
    SimpleString::operator=(in_RDI,other);
    SimpleString::~SimpleString((SimpleString *)0x173332);
    SimpleString::deallocStringBuffer
              ((char *)CONCAT44(iVar1,in_stack_ffffffffffffff00),(size_t)size_00,(char *)in_RDI,
               (size_t)other);
    sVar3 = extraout_RDX_00;
  }
  SVar4.bufferSize_ = sVar3;
  SVar4.buffer_ = (char *)size_00;
  return SVar4;
}

Assistant:

SimpleString VStringFromFormat(const char* format, va_list args)
{
    va_list argsCopy;
    va_copy(argsCopy, args);
    enum
    {
        sizeOfdefaultBuffer = 100
    };
    char defaultBuffer[sizeOfdefaultBuffer];
    SimpleString resultString;

    size_t size = (size_t)PlatformSpecificVSNprintf(defaultBuffer, sizeOfdefaultBuffer, format, args);
    if (size < sizeOfdefaultBuffer) {
        resultString = SimpleString(defaultBuffer);
    }
    else {
        size_t newBufferSize = size + 1;
        char* newBuffer = SimpleString::allocStringBuffer(newBufferSize, __FILE__, __LINE__);
        PlatformSpecificVSNprintf(newBuffer, newBufferSize, format, argsCopy);
        resultString = SimpleString(newBuffer);

        SimpleString::deallocStringBuffer(newBuffer, newBufferSize, __FILE__, __LINE__);
    }
    va_end(argsCopy);
    return resultString;
}